

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_parse_local(PHYSFS_Io *io,ZIPentry *entry)

{
  int iVar1;
  ushort local_2a;
  ushort local_28;
  PHYSFS_uint16 local_26;
  PHYSFS_uint32 PStack_24;
  PHYSFS_uint16 extralen;
  PHYSFS_uint16 fnamelen;
  PHYSFS_uint16 ui16;
  PHYSFS_uint32 ui32;
  ZIPentry *entry_local;
  PHYSFS_Io *io_local;
  
  _fnamelen = entry;
  entry_local = (ZIPentry *)io;
  iVar1 = (*io->seek)(io,entry->offset);
  if (iVar1 == 0) {
    io_local._4_4_ = 0;
  }
  else {
    iVar1 = readui32((PHYSFS_Io *)entry_local,&stack0xffffffffffffffdc);
    if (iVar1 == 0) {
      io_local._4_4_ = 0;
    }
    else if (PStack_24 == 0x4034b50) {
      iVar1 = readui16((PHYSFS_Io *)entry_local,&local_26);
      if (iVar1 == 0) {
        io_local._4_4_ = 0;
      }
      else if (local_26 == _fnamelen->version_needed) {
        iVar1 = readui16((PHYSFS_Io *)entry_local,&local_26);
        if (iVar1 == 0) {
          io_local._4_4_ = 0;
        }
        else {
          iVar1 = readui16((PHYSFS_Io *)entry_local,&local_26);
          if (iVar1 == 0) {
            io_local._4_4_ = 0;
          }
          else if (local_26 == _fnamelen->compression_method) {
            iVar1 = readui32((PHYSFS_Io *)entry_local,&stack0xffffffffffffffdc);
            if (iVar1 == 0) {
              io_local._4_4_ = 0;
            }
            else {
              iVar1 = readui32((PHYSFS_Io *)entry_local,&stack0xffffffffffffffdc);
              if (iVar1 == 0) {
                io_local._4_4_ = 0;
              }
              else if ((PStack_24 == 0) || (PStack_24 == _fnamelen->crc)) {
                iVar1 = readui32((PHYSFS_Io *)entry_local,&stack0xffffffffffffffdc);
                if (iVar1 == 0) {
                  io_local._4_4_ = 0;
                }
                else if (((PStack_24 == 0) || (PStack_24 == 0xffffffff)) ||
                        ((ulong)PStack_24 == _fnamelen->compressed_size)) {
                  iVar1 = readui32((PHYSFS_Io *)entry_local,&stack0xffffffffffffffdc);
                  if (iVar1 == 0) {
                    io_local._4_4_ = 0;
                  }
                  else if (((PStack_24 == 0) || (PStack_24 == 0xffffffff)) ||
                          ((ulong)PStack_24 == _fnamelen->uncompressed_size)) {
                    iVar1 = readui16((PHYSFS_Io *)entry_local,&local_28);
                    if (iVar1 == 0) {
                      io_local._4_4_ = 0;
                    }
                    else {
                      iVar1 = readui16((PHYSFS_Io *)entry_local,&local_2a);
                      if (iVar1 == 0) {
                        io_local._4_4_ = 0;
                      }
                      else {
                        _fnamelen->offset =
                             (long)(int)((uint)local_28 + (uint)local_2a + 0x1e) + _fnamelen->offset
                        ;
                        io_local._4_4_ = 1;
                      }
                    }
                  }
                  else {
                    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                    io_local._4_4_ = 0;
                  }
                }
                else {
                  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                  io_local._4_4_ = 0;
                }
              }
              else {
                PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                io_local._4_4_ = 0;
              }
            }
          }
          else {
            PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
            io_local._4_4_ = 0;
          }
        }
      }
      else {
        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
        io_local._4_4_ = 0;
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
      io_local._4_4_ = 0;
    }
  }
  return io_local._4_4_;
}

Assistant:

static int zip_parse_local(PHYSFS_Io *io, ZIPentry *entry)
{
    PHYSFS_uint32 ui32;
    PHYSFS_uint16 ui16;
    PHYSFS_uint16 fnamelen;
    PHYSFS_uint16 extralen;

    /*
     * crc and (un)compressed_size are always zero if this is a "JAR"
     *  archive created with Sun's Java tools, apparently. We only
     *  consider this archive corrupted if those entries don't match and
     *  aren't zero. That seems to work well.
     * We also ignore a mismatch if the value is 0xFFFFFFFF here, since it's
     *  possible that's a Zip64 thing.
     */

    /* !!! FIXME: apparently these are zero if general purpose bit 3 is set,
       !!! FIXME:  which is probably true for Jar files, fwiw, but we don't
       !!! FIXME:  care about these values anyhow. */

    BAIL_IF_ERRPASS(!io->seek(io, entry->offset), 0);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), 0);
    BAIL_IF(ui32 != ZIP_LOCAL_FILE_SIG, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF_ERRPASS(!readui16(io, &ui16), 0);
    BAIL_IF(ui16 != entry->version_needed, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF_ERRPASS(!readui16(io, &ui16), 0);  /* general bits. */
    BAIL_IF_ERRPASS(!readui16(io, &ui16), 0);
    BAIL_IF(ui16 != entry->compression_method, PHYSFS_ERR_CORRUPT, 0);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), 0);  /* date/time */
    BAIL_IF_ERRPASS(!readui32(io, &ui32), 0);
    BAIL_IF(ui32 && (ui32 != entry->crc), PHYSFS_ERR_CORRUPT, 0);

    BAIL_IF_ERRPASS(!readui32(io, &ui32), 0);
    BAIL_IF(ui32 && (ui32 != 0xFFFFFFFF) &&
                  (ui32 != entry->compressed_size), PHYSFS_ERR_CORRUPT, 0);

    BAIL_IF_ERRPASS(!readui32(io, &ui32), 0);
    BAIL_IF(ui32 && (ui32 != 0xFFFFFFFF) &&
                 (ui32 != entry->uncompressed_size), PHYSFS_ERR_CORRUPT, 0);

    BAIL_IF_ERRPASS(!readui16(io, &fnamelen), 0);
    BAIL_IF_ERRPASS(!readui16(io, &extralen), 0);

    entry->offset += fnamelen + extralen + 30;
    return 1;
}